

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirit2_playground.cpp
# Opt level: O3

void __thiscall client::mini_xml_node_printer::operator()(mini_xml_node_printer *this,string *text)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int iVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (-4 < this->indent) {
    iVar2 = this->indent + 4;
    do {
      uStack_28._0_7_ = CONCAT16(0x20,(undefined6)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_28 + 6),1);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"text: \"",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(text->_M_dataplus)._M_p,text->_M_string_length);
  uStack_28 = CONCAT17(0x22,(undefined7)uStack_28);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_28 + 7),1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void operator()(std::string const& text) const
        {
            tab(indent+tabsize);
            std::cout << "text: \"" << text << '"' << std::endl;
        }